

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O2

void CreateMsgWindow(float fTimeToDisplay,int numSee,int numShow,int bufTime)

{
  bool bVar1;
  logLevelTy local_250;
  float local_24c;
  unique_lock<std::recursive_mutex> lock;
  char aszMsgTxt [500];
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&gListMutex);
  if (listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node
      .super__List_node_base._M_next != (_List_node_base *)&listTexts_abi_cxx11_) {
    std::__cxx11::string::substr
              ((ulong)aszMsgTxt,
               (ulong)&listTexts_abi_cxx11_.
                       super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node.
                       super__List_node_base._M_next[1]._M_prev);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            aszMsgTxt,"Filling buffer: seeing ");
    std::__cxx11::string::~string((string *)aszMsgTxt);
    if (bVar1) {
      std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::pop_front(&listTexts_abi_cxx11_);
    }
  }
  if (-1 < bufTime) {
    snprintf(aszMsgTxt,500,"Filling buffer: seeing %d aircraft, displaying %d, still %ds to buffer",
             (ulong)(uint)numSee,numShow,(ulong)(uint)bufTime);
    local_24c = -fTimeToDisplay;
    local_250 = logINFO;
    std::__cxx11::list<dispTextTy,std::allocator<dispTextTy>>::
    emplace_front<float,logLevelTy,char(&)[500]>
              ((list<dispTextTy,std::allocator<dispTextTy>> *)&listTexts_abi_cxx11_,&local_24c,
               &local_250,&aszMsgTxt);
  }
  WndMsg::DoShow();
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void CreateMsgWindow(float fTimeToDisplay, int numSee, int numShow, int bufTime)
{
    // This entry shall always be the first one in the list
    // So let's see if it is already the first one, then we'd remove it first
    std::unique_lock<std::recursive_mutex> lock(gListMutex);
    if (!listTexts.empty() && listTexts.front().text.substr(0,23) == MSG_BUF_FILL_BEGIN)
        listTexts.pop_front();
    
    // Now create the actual message if there is anything to show
    if (bufTime >= 0) {
        char aszMsgTxt[500];
        snprintf(aszMsgTxt, sizeof(aszMsgTxt), MSG_BUF_FILL_COUNTDOWN,
                 numSee, numShow, bufTime);
        // add to list of display texts _at front_
        listTexts.emplace_front(-fTimeToDisplay, logINFO, aszMsgTxt);
    }
    
    // Show the window
    WndMsg::DoShow();
}